

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_acoustics.c
# Opt level: O3

t_float dbtorms(t_float f)

{
  double dVar1;
  t_float tVar2;
  float fVar3;
  
  tVar2 = 0.0;
  if (0.0 < f) {
    fVar3 = 485.0;
    if (f <= 485.0) {
      fVar3 = f;
    }
    dVar1 = exp(((double)fVar3 + -100.0) * 0.1151292546497023);
    tVar2 = (t_float)dVar1;
  }
  return tVar2;
}

Assistant:

t_float dbtorms(t_float f)
{
    if (f <= 0)
        return(0);
    else
    {
        if (f > 485)
            f = 485;
    }
    return (exp((LOGTEN * 0.05) * (f-100.)));
}